

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char sqlite3ExprAffinity(Expr *pExpr)

{
  u8 uVar1;
  char cVar2;
  ExprList *pEVar3;
  
  do {
    if ((pExpr->flags >> 9 & 1) != 0) {
      return '\0';
    }
    if ((pExpr->flags >> 0xc & 1) != 0) {
      do {
        pExpr = pExpr->pLeft;
      } while ((pExpr->flags & 0x1000) != 0);
    }
    uVar1 = pExpr->op;
    if (uVar1 == 0xa8) {
      uVar1 = pExpr->op2;
LAB_0019689f:
      if (uVar1 != 0xaa) {
        if ((uVar1 == 0xa4) || (uVar1 == 0xa2)) {
          if ((pExpr->y).pTab != (Table *)0x0) {
            if (-1 < (long)pExpr->iColumn) {
              return ((pExpr->y).pTab)->aCol[pExpr->iColumn].affinity;
            }
            return 'D';
          }
        }
        else if (uVar1 == '$') {
          cVar2 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
          return cVar2;
        }
        return pExpr->affinity;
      }
      pEVar3 = (ExprList *)
               &((pExpr->pLeft->x).pSelect)->pEList->a[(long)pExpr->iColumn + -1].sortOrder;
    }
    else {
      if (uVar1 != 0x83) goto LAB_0019689f;
      pEVar3 = ((pExpr->x).pSelect)->pEList;
    }
    pExpr = pEVar3->a[0].pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(Expr *pExpr){
  int op;
  if( pExpr->flags & EP_Generic ) return 0;
  while( ExprHasProperty(pExpr, EP_Skip) ){
    assert( pExpr->op==TK_COLLATE );
    pExpr = pExpr->pLeft;
    assert( pExpr!=0 );
  }
  op = pExpr->op;
  if( op==TK_SELECT ){
    assert( pExpr->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
  if( op==TK_REGISTER ) op = pExpr->op2;
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( (op==TK_AGG_COLUMN || op==TK_COLUMN) && pExpr->y.pTab ){
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  return pExpr->affinity;
}